

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_color_replace_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,rf_color replace,void *dst
          ,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  rf_color rVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  rf_color local_6c;
  void *local_68;
  rf_image *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_6c = replace;
  local_68 = dst;
  if (image.valid != false) {
    iVar2 = rf_bits_per_pixel(image.format);
    iVar2 = iVar2 * image.height * image.width;
    iVar4 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    if (iVar4 >> 3 <= dst_size) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->width = 0;
      __return_storage_ptr__->height = 0;
      __return_storage_ptr__->format = 0;
      __return_storage_ptr__->valid = false;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
      return __return_storage_ptr__;
    }
  }
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    lVar5 = *(long *)(&DAT_0017a718 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
  }
  else {
    lVar5 = 0;
  }
  local_48 = (long)image.height;
  local_60 = __return_storage_ptr__;
  if (0 < local_48) {
    local_50 = (long)image.width;
    local_58 = lVar5 * local_50;
    lVar7 = 0;
    local_40 = 0;
    do {
      lVar6 = local_50;
      local_38 = lVar7;
      if (0 < (int)local_50) {
        do {
          rVar3 = rf_format_one_pixel_to_rgba32
                            ((void *)((long)image.data + (lVar7 >> 0x20)),image.format);
          if (rVar3 == color) {
            rf_format_one_pixel(&local_6c,RF_UNCOMPRESSED_R8G8B8A8,
                                (void *)((lVar7 >> 0x20) + (long)local_68),image.format);
          }
          lVar7 = lVar7 + lVar5;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      local_40 = local_40 + 1;
      lVar7 = local_38 + local_58;
    } while (local_40 != local_48);
  }
  local_60->data = image.data;
  local_60->width = (int)image._8_8_;
  local_60->height = (int)((ulong)image._8_8_ >> 0x20);
  uVar1 = image._16_8_;
  local_60->format = (int)uVar1;
  local_60->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&local_60->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
  local_60->data = local_68;
  return local_60;
}

Assistant:

RF_API rf_image rf_image_color_replace_to_buffer(rf_image image, rf_color color, rf_color replace, void* dst, rf_int dst_size)
{
    if (image.valid && dst_size >= rf_image_size(image)) return (rf_image) {0};

    rf_image result = {0};

    int bpp = rf_bytes_per_pixel(image.format);

    for (rf_int y = 0; y < image.height; y++)
    {
        for (rf_int x = 0; x < image.width; x++)
        {
            int index = y * image.width + x;

            void* src_pixel = ((unsigned char*)image.data) + index * bpp;
            void* dst_pixel = ((unsigned char*)dst) + index * bpp;

            rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

            if (rf_color_match(pixel_rgba32, color))
            {
                rf_format_one_pixel(&replace, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
            }
        }
    }

    result = image;
    result.data = dst;

    return result;
}